

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteArray.h
# Opt level: O0

int __thiscall ByteArray::getWord(ByteArray *this,size_t pos,Endianness endianness)

{
  size_t sVar1;
  byte *pbVar2;
  uchar *d;
  Endianness endianness_local;
  size_t pos_local;
  ByteArray *this_local;
  
  sVar1 = size(this);
  if (pos + 1 < sVar1) {
    pbVar2 = data(this,0);
    if (endianness == Little) {
      this_local._4_4_ = (uint)CONCAT11(pbVar2[pos + 1],pbVar2[pos]);
    }
    else {
      this_local._4_4_ = (uint)CONCAT11(pbVar2[pos],pbVar2[pos + 1]);
    }
  }
  else {
    this_local._4_4_ = 0xffffffff;
  }
  return this_local._4_4_;
}

Assistant:

int getWord(size_t pos, Endianness endianness = Endianness::Little) const
	{
		if (pos+1 >= this->size()) return -1;
		unsigned char* d = (unsigned char*) this->data();

		if (endianness == Endianness::Little)
		{
			return d[pos+0] | (d[pos+1] << 8);
		} else {
			return d[pos+1] | (d[pos+0] << 8);
		}
	}